

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void cnn::GraphOptimize(ComputationGraph *cg)

{
  size_type *psVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint __val;
  Node *pNVar4;
  pointer pVVar5;
  bool bVar6;
  ComputationGraph *pCVar7;
  char cVar8;
  char cVar9;
  pointer ppNVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  uint uVar13;
  long lVar14;
  pointer pVVar15;
  ulong uVar16;
  int weight;
  int iVar17;
  long lVar18;
  int iVar19;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  vector<int,_std::allocator<int>_> longest_paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  ComputationGraph *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_d8);
  ppNVar10 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar14 = (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppNVar10;
  if (lVar14 != 0) {
    uVar16 = 0;
    do {
      pNVar4 = ppNVar10[uVar16];
      pVVar15 = *(pointer *)
                 &(pNVar4->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl;
      pVVar5 = (pNVar4->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar15 != pVVar5) {
        lVar18 = (long)pVVar5 - (long)pVVar15;
        iVar17 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16];
        do {
          iVar19 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[pVVar15->t] + (uint)(lVar18 == 0x1c);
          if (iVar17 < iVar19) {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar16] = iVar19;
            iVar17 = iVar19;
          }
          pVVar15 = pVVar15 + 1;
        } while (pVVar15 != pVVar5);
      }
      uVar16 = uVar16 + 1;
    } while ((uVar16 & 0xffffffff) < (ulong)(lVar14 >> 3));
  }
  ppNVar10 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar10) {
    paVar3 = &local_d8.field_2;
    uVar16 = 0;
    local_58 = cg;
    do {
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVVar5 = (ppNVar10[uVar16]->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_50 = uVar16;
      for (pVVar15 = (ppNVar10[uVar16]->args).
                     super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start; pVVar15 != pVVar5;
          pVVar15 = pVVar15 + 1) {
        __val = pVVar15->t;
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"x","");
        cVar9 = '\x01';
        if (9 < __val) {
          uVar13 = __val;
          cVar8 = '\x04';
          do {
            cVar9 = cVar8;
            if (uVar13 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_00195749;
            }
            if (uVar13 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_00195749;
            }
            if (uVar13 < 10000) goto LAB_00195749;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar8 = cVar9 + '\x04';
          } while (bVar6);
          cVar9 = cVar9 + '\x01';
        }
LAB_00195749:
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,__val);
        uVar16 = 0xf;
        if (local_98 != local_88) {
          uVar16 = local_88[0];
        }
        uVar2 = CONCAT44(uStack_ac,local_b0) + local_90;
        if (uVar16 < uVar2) {
          uVar16 = 0xf;
          if (local_b8 != local_a8) {
            uVar16 = local_a8[0];
          }
          if (uVar16 < uVar2) goto LAB_001957b4;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_001957b4:
          puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8)
          ;
        }
        psVar1 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_d8.field_2._M_allocated_capacity = *psVar1;
          local_d8.field_2._8_8_ = puVar11[3];
          local_d8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar1;
          local_d8._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_d8._M_string_length = puVar11[1];
        *puVar11 = psVar1;
        puVar11[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"LONGEST PATH: ",0xe)
      ;
      uVar16 = local_50;
      poVar12 = (ostream *)
                std::ostream::operator<<
                          (&std::cerr,
                           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_50]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tx",2);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," = ",3);
      pCVar7 = local_58;
      pNVar4 = (local_58->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      (*pNVar4->_vptr_Node[3])(&local_d8,pNVar4,&local_78);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      uVar16 = (ulong)((int)uVar16 + 1);
      ppNVar10 = (pCVar7->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(pCVar7->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar10 >> 3)
            );
  }
  abort();
}

Assistant:

void GraphOptimize(ComputationGraph* cg) {
  // topo sort
  vector<Node*>& nodes = cg->nodes;
  vector<int> longest_paths(nodes.size());
  for (unsigned i = 0; i < nodes.size(); ++i) {
    auto& v = *nodes[i];  // vertex v_i
    auto& lp = longest_paths[i]; // distance to v_i
    for (auto e : v.args) {
      int weight = 0;
      if (v.args.size() == 7) weight = 1;
      int pte = longest_paths[e] + weight;
      if (pte > lp) lp = pte;
    }
  }
  for (unsigned i = 0; i < nodes.size(); ++i) {
    vector<string> x;
    for (auto e : nodes[i]->args) {
      x.push_back(string("x") + to_string(e));
    }
    cerr << "LONGEST PATH: " << longest_paths[i] << "\tx" << i << " = " << nodes[i]->as_string(x) << endl;
  }
  abort();// DEBUGGING
}